

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

bool __thiscall json::LoadObject::process<unsigned_int>(LoadObject *this,char *name,uint *value)

{
  int iVar1;
  char *pcVar2;
  char *end;
  uint *value_local;
  char *name_local;
  LoadObject *this_local;
  
  iVar1 = strcmp(this->_prev_name,name);
  if (-1 < iVar1) {
    __assert_fail("false && \"variables should be serialized in alphabetical order\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yak32[P]glw_json/tests/../glw_json.h"
                  ,0x10c,"bool json::LoadObject::process(const char *, V &) [V = unsigned int]");
  }
  this->_prev_name = name;
  if ((this->current < this->props_size) &&
     (iVar1 = strncmp(name,(*this->props)[this->current].param.str,
                      (*this->props)[this->current].param.len), iVar1 == 0)) {
    pcVar2 = load((*this->props)[this->current].value.str,(*this->props)[this->current].value.len,
                  value,this->options);
    if (pcVar2 == (*this->props)[this->current].value.str + (*this->props)[this->current].value.len)
    {
      this->current = this->current + 1;
      return true;
    }
    this->error_pos = pcVar2;
  }
  else if ((this->options & 2U) == 0) {
    if ((this->options & 1U) != 0) {
      *value = 0;
    }
    return true;
  }
  this->current = this->props_size;
  return false;
}

Assistant:

bool process(const char* name, V& value) {
#ifndef NDEBUG
		// this check could fail if name is dynamically allocated and was freed after usage
		// if Sublime Text 3 is used, select everything inside serialize() and press F9
		if (strcmp(_prev_name, name) >= 0)
			assert(false && "variables should be serialized in alphabetical order");
		_prev_name = name;
#endif
		if (current < props_size &&
			strncmp(name, props[current].param.str, props[current].param.len) == 0) {
			const char* end =
				load(props[current].value.str, props[current].value.len, value, options);
			if (end == props[current].value.str + props[current].value.len) {
				++current;
				return true;
			}
			error_pos = end;
		}
		else if (!(options & ERROR_IF_ABSENT)) {
			if (options & RESET_IF_ABSENT)
				value = V();
			return true;
		}
		current = props_size; // skip parsing
		return false;
	}